

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicyULT.cpp
# Opt level: O1

void __thiscall CTestXe_LPGCachePolicy::CheckVirtualL3CachePolicy(CTestXe_LPGCachePolicy *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined2 uVar1;
  bool bVar2;
  ulong uVar3;
  uint32_t MocsIndex;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 local_90 [8];
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint32_t L4_WB_CACHEABLE;
  uint32_t L4_WT_CACHEABLE;
  uint32_t L4_UNCACHEABLE;
  uint32_t L3_WB_CACHEABLE;
  uint32_t L3_UNCACHEABLE;
  uint32_t AssignedMocsIdx;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  ClientRequest.Override = 0;
  ClientRequest.IsOverridenByRegkey = 1;
  L4_WB_CACHEABLE = 3;
  L4_WT_CACHEABLE = 3;
  L4_UNCACHEABLE = 1;
  iVar4 = 0;
  do {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
              (CommonULT::pGmmULTClientContext,iVar4);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x10);
  uVar7 = 0;
  this_00 = &gtest_ar.message_;
  do {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (local_90,CommonULT::pGmmULTClientContext,uVar7 & 0xffffffff);
    L3_WB_CACHEABLE = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    uVar3 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))();
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    uVar6 = (uint)(uVar3 >> 0x20);
    L3_UNCACHEABLE = CONCAT22(L3_UNCACHEABLE._2_2_,(short)(uVar3 >> 0x20)) & 0xffff0001;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              (local_48,"0","Mocs.L3.ESC",(int *)this_00,(unsigned_short *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,": ESC is non-zero",
                 0x11);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    L3_UNCACHEABLE = CONCAT22(L3_UNCACHEABLE._2_2_,(short)(uVar6 >> 1)) & 0xffff0007;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              (local_48,"0","Mocs.L3.SCC",(int *)this_00,(unsigned_short *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,": SCC is non-zero",
                 0x11);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    L3_UNCACHEABLE = CONCAT22(L3_UNCACHEABLE._2_2_,(short)(uVar3 >> 0x28)) & 0xffff00ff;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              (local_48,"0","Mocs.L3.Reserved",(int *)this_00,(unsigned_short *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": Reserved field is non-zero",0x1c);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0x10;
    testing::internal::CmpHelperGT<int,unsigned_int>
              (local_48,"(16)","AssignedMocsIdx",(int *)this_00,&L3_WB_CACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": MOCS Index greater than MAX allowed (16)",0x2a);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0x9f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    L3_UNCACHEABLE = (uint)uVar3 & 3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.Xe_LPG.Reserved0",(int *)this_00,(uint *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": : Reserved field is non-zero",0x1e);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa0,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    L3_UNCACHEABLE = (uint)(uVar3 >> 4) & 3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.Xe_LPG.Reserved1",(int *)this_00,(uint *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": : Reserved field is non-zero",0x1e);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa1,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    L3_UNCACHEABLE = (uint)(uVar3 >> 6) & 3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.Xe_LPG.Reserved2",(int *)this_00,(uint *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": : Reserved field is non-zero",0x1e);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa2,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    L3_UNCACHEABLE = (uint)(uVar3 >> 9) & 0x7fffff;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.Xe_LPG.Reserved3",(int *)this_00,(uint *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": : Reserved field is non-zero",0x1e);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa3,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 1;
    L3_UNCACHEABLE = (uint)(uVar3 >> 8) & 1;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"1","Mocs.LeCC.Xe_LPG.igPAT",(int *)this_00,(uint *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                 ": Incorrect igPAT cachebility setting",0x25);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                 ,0xa4,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
        }
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar1 = (undefined2)(uVar6 >> 4);
    if ((ClientRequest._4_4_ & 0x30000) == 0) {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT62(gtest_ar.message_.ptr_._2_6_,uVar1) & 0xffffffffffff0003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_short>
                (local_48,"L3_UNCACHEABLE","Mocs.L3.Cacheability",&L4_UNCACHEABLE,
                 (unsigned_short *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                   ": Incorrect L3 cachebility setting",0x22);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xaf,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT62(gtest_ar.message_.ptr_._2_6_,uVar1) & 0xffffffffffff0003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_short>
                (local_48,"L3_WB_CACHEABLE","Mocs.L3.Cacheability",&L4_WT_CACHEABLE,
                 (unsigned_short *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                   ": Incorrect L3 cachebility setting",0x22);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xab,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar6 = (uint)uVar3 >> 2;
    if ((ClientRequest._4_4_ & 3) == 2) {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar6) & 0xffffffff00000003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"L4_WT_CACHEABLE","Mocs.LeCC.Xe_LPG.L4CC",
                 &ClientRequest.IsOverridenByRegkey,(uint *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                   ": Incorrect L4CC cachebility setting",0x24);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xbc,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else if ((ClientRequest._4_4_ & 3) == 1) {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar6) & 0xffffffff00000003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"L4_WB_CACHEABLE","Mocs.LeCC.Xe_LPG.L4CC",&ClientRequest.Override,
                 (uint *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                   ": Incorrect L4CC cachebility setting",0x24);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xb7,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar6) & 0xffffffff00000003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"L4_UNCACHEABLE","Mocs.LeCC.Xe_LPG.L4CC",&L4_WB_CACHEABLE,(uint *)this_00)
      ;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                   ": Incorrect L4CC cachebility setting",0x24);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmXe_LPGCachePolicyULT.cpp"
                   ,0xc0,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
          }
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x11e);
  return;
}

Assistant:

void CTestXe_LPGCachePolicy::CheckVirtualL3CachePolicy()
{
    const uint32_t L4_WB_CACHEABLE = 0x0;
    const uint32_t L4_WT_CACHEABLE = 0x1;
    const uint32_t L4_UNCACHEABLE  = 0x3;

    const uint32_t L3_WB_CACHEABLE = 0x3;
    const uint32_t L3_UNCACHEABLE  = 0x1;

    for(uint32_t MocsIndex = 0; MocsIndex < GMM_XE_NUM_MOCS_ENTRIES; MocsIndex++)
    {
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs = pGmmULTClientContext->GetCachePolicyTlbElement(MocsIndex);
        //printf("Xe LPG: MocsIndex: %d --> Global Index: [0x%x]\n", MocsIndex, Mocs.LeCC.Xe_LPG.DwordValue);
        //printf("Xe LPG: MocsIndex: %d --> L3 Index: [0x%x]\n", MocsIndex, Mocs.L3.UshortValue);
    }

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                AssignedMocsIdx = ClientRequest.MemoryObjectOverride.XE_LPG.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);
        uint32_t                     StartMocsIdx    = 0;

        EXPECT_EQ(0, Mocs.L3.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.L3.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        EXPECT_EQ(0, Mocs.L3.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";
        // Check if Mocs Index is not greater than GMM_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_XE_NUM_MOCS_ENTRIES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (16)";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved0) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved1) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved2) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Xe_LPG.Reserved3) << "Usage# " << Usage << ": : Reserved field is non-zero";
        EXPECT_EQ(1, Mocs.LeCC.Xe_LPG.igPAT) << "Usage# " << Usage << ": Incorrect igPAT cachebility setting";

        //printf("Xe LPG: Usage: %d --> Index: [%d]\n", Usage, AssignedMocsIdx);

        //L3
        if (ClientRequest.L3CC)
        {
            EXPECT_EQ(L3_WB_CACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }
        else
        {
            EXPECT_EQ(L3_UNCACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }

        // L4 cache memory- 0: UC, 1:WB, 2: WT
        switch(ClientRequest.L4CC)
        {
            case 0x1:
            {
                EXPECT_EQ(L4_WB_CACHEABLE, Mocs.LeCC.Xe_LPG.L4CC) << "Usage# " << Usage << ": Incorrect L4CC cachebility setting";
                break;
            }
            case 0x2:
            {
                EXPECT_EQ(L4_WT_CACHEABLE, Mocs.LeCC.Xe_LPG.L4CC) << "Usage# " << Usage << ": Incorrect L4CC cachebility setting";
                break;
            }
            default:
                EXPECT_EQ(L4_UNCACHEABLE, Mocs.LeCC.Xe_LPG.L4CC) << "Usage# " << Usage << ": Incorrect L4CC cachebility setting";
        }
    }
}